

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::relocate
          (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *this,qsizetype offset,
          AnchorVertexPair ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *in_RDI;
  AnchorVertexPair ***unaff_retaddr;
  AnchorVertexPair **res;
  AnchorVertexPair **first;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QtGraphicsAnchorLayout::AnchorVertexPair*,long_long>
            (first,(longlong)in_RDI,(AnchorVertexPair **)0x95b3e7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair*>,QtGraphicsAnchorLayout::AnchorVertexPair*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }